

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O2

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
IOBoard::readBoardFromFile
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,IOBoard *this,string *fileName)

{
  bool bVar1;
  uint uVar2;
  istream *piVar3;
  istream *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  ulong local_3e8;
  string value_as_string;
  stringstream sstr;
  undefined1 local_3b0 [376];
  ifstream ifs;
  streambuf local_228 [16];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,(string *)fileName,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
    std::ostream::operator<<(local_3b0,local_228);
    std::ifstream::close();
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value_as_string._M_dataplus._M_p = (pointer)&value_as_string.field_2;
    value_as_string._M_string_length = 0;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value_as_string.field_2._M_local_buf[0] = '\0';
    while (this_00 = (istream *)&sstr,
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&sstr,(string *)&value_as_string,','),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      uVar2 = std::__cxx11::stoi(&value_as_string,(size_t *)0x0,10);
      local_3e8 = (ulong)uVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&values,&local_3e8);
    }
    bVar1 = validate((IOBoard *)this_00,&values);
    if (bVar1) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10) =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = bVar1;
    std::__cxx11::string::~string((string *)&value_as_string);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
  }
  else {
    Message::putMessage(OK);
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = false;
  }
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<size_t>> IOBoard::readBoardFromFile( const std::string& fileName )
{
    std::ifstream ifs( fileName );
    if ( !ifs )
    {
        Message::putMessage( Result::READ_BOARD_ERROR );
        return std::nullopt;
    }

    std::stringstream sstr;
    sstr << ifs.rdbuf();
    ifs.close();

    std::vector<size_t> values;
    std::string value_as_string;
    uint boardValue;
    while( std::getline( sstr, value_as_string, ',' ))
    {
        try
        {
            boardValue = std::stoi( value_as_string );
        }
        catch (...)
        {
            Message::putMessage( Result::FILE_ERROR_VALUE_NOT_NUMBER );
            return std::nullopt;
        }
        values.push_back( boardValue );
    }

    if ( validate( values ) == false )
    {
        return std::nullopt;
    }
    return values;
}